

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackCheck.cpp
# Opt level: O0

void __thiscall wasm::EnforceStackLimits::~EnforceStackLimits(EnforceStackLimits *this)

{
  EnforceStackLimits *this_local;
  
  ~EnforceStackLimits(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

EnforceStackLimits(const Global* stackPointer,
                     const Global* stackBase,
                     const Global* stackLimit,
                     Builder& builder,
                     Name handler)
    : stackPointer(stackPointer), stackBase(stackBase), stackLimit(stackLimit),
      builder(builder), handler(handler) {}